

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

size_t __thiscall
spvtools::opt::analysis::Type::ComputeHashValue(Type *this,size_t hash,SeenTypes *seen)

{
  bool bVar1;
  int iVar2;
  iterator ppTVar3;
  iterator __last;
  Type **ppTVar4;
  reference vals;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *d;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  Type *local_38;
  Type *local_30;
  SmallVector<const_spvtools::opt::analysis::Type_*,_8UL> *local_28;
  SeenTypes *seen_local;
  size_t hash_local;
  Type *this_local;
  
  local_28 = seen;
  seen_local = (SeenTypes *)hash;
  hash_local = (size_t)this;
  ppTVar3 = utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::begin(seen);
  __last = utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::end(local_28);
  local_30 = this;
  ppTVar4 = std::find<spvtools::opt::analysis::Type_const**,spvtools::opt::analysis::Type_const*>
                      (ppTVar3,__last,&local_30);
  ppTVar3 = utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::end(local_28);
  if (ppTVar4 == ppTVar3) {
    local_38 = this;
    utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::push_back(local_28,&local_38);
    __range2._4_4_ = this->kind_;
    seen_local = (SeenTypes *)
                 utils::hash_combine<unsigned_int>((size_t)seen_local,(uint *)((long)&__range2 + 4))
    ;
    __end2 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::begin(&this->decorations_);
    d = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::end(&this->decorations_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                       *)&d), bVar1) {
      vals = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator*(&__end2);
      seen_local = (SeenTypes *)utils::hash_combine<unsigned_int>((size_t)seen_local,vals);
      __gnu_cxx::
      __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
      ::operator++(&__end2);
    }
    switch(this->kind_) {
    case kVoid:
      iVar2 = (*this->_vptr_Type[6])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var,iVar2),seen_local,local_28);
      break;
    case kBool:
      iVar2 = (*this->_vptr_Type[8])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_00,iVar2),seen_local,local_28);
      break;
    case kInteger:
      iVar2 = (*this->_vptr_Type[10])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_01,iVar2),seen_local,local_28);
      break;
    case kFloat:
      iVar2 = (*this->_vptr_Type[0xc])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_02,iVar2),seen_local,local_28);
      break;
    case kVector:
      iVar2 = (*this->_vptr_Type[0xe])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_03,iVar2),seen_local,local_28);
      break;
    case kMatrix:
      iVar2 = (*this->_vptr_Type[0x10])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_04,iVar2),seen_local,local_28);
      break;
    case kImage:
      iVar2 = (*this->_vptr_Type[0x12])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_05,iVar2),seen_local,local_28);
      break;
    case kSampler:
      iVar2 = (*this->_vptr_Type[0x14])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_06,iVar2),seen_local,local_28);
      break;
    case kSampledImage:
      iVar2 = (*this->_vptr_Type[0x16])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_07,iVar2),seen_local,local_28);
      break;
    case kArray:
      iVar2 = (*this->_vptr_Type[0x18])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_08,iVar2),seen_local,local_28);
      break;
    case kRuntimeArray:
      iVar2 = (*this->_vptr_Type[0x1a])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_09,iVar2),seen_local,local_28);
      break;
    case kNodePayloadArrayAMDX:
      iVar2 = (*this->_vptr_Type[0x1c])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_10,iVar2),seen_local,local_28);
      break;
    case kStruct:
      iVar2 = (*this->_vptr_Type[0x1e])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_11,iVar2),seen_local,local_28);
      break;
    case kOpaque:
      iVar2 = (*this->_vptr_Type[0x20])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_12,iVar2),seen_local,local_28);
      break;
    case kPointer:
      iVar2 = (*this->_vptr_Type[0x22])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_13,iVar2),seen_local,local_28);
      break;
    case kFunction:
      iVar2 = (*this->_vptr_Type[0x24])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_14,iVar2),seen_local,local_28);
      break;
    case kEvent:
      iVar2 = (*this->_vptr_Type[0x26])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_15,iVar2),seen_local,local_28);
      break;
    case kDeviceEvent:
      iVar2 = (*this->_vptr_Type[0x28])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_16,iVar2),seen_local,local_28);
      break;
    case kReserveId:
      iVar2 = (*this->_vptr_Type[0x2a])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_17,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_17,iVar2),seen_local,local_28);
      break;
    case kQueue:
      iVar2 = (*this->_vptr_Type[0x2c])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_18,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_18,iVar2),seen_local,local_28);
      break;
    case kPipe:
      iVar2 = (*this->_vptr_Type[0x2e])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_19,iVar2),seen_local,local_28);
      break;
    case kForwardPointer:
      iVar2 = (*this->_vptr_Type[0x30])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_20,iVar2),seen_local,local_28);
      break;
    case kPipeStorage:
      iVar2 = (*this->_vptr_Type[0x32])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_21,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_21,iVar2),seen_local,local_28);
      break;
    case kNamedBarrier:
      iVar2 = (*this->_vptr_Type[0x34])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_22,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_22,iVar2),seen_local,local_28);
      break;
    case kAccelerationStructureNV:
      iVar2 = (*this->_vptr_Type[0x36])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_23,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_23,iVar2),seen_local,local_28);
      break;
    case kCooperativeMatrixNV:
      iVar2 = (*this->_vptr_Type[0x38])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_24,iVar2),seen_local,local_28);
      break;
    case kCooperativeMatrixKHR:
      iVar2 = (*this->_vptr_Type[0x3a])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_25,iVar2),seen_local,local_28);
      break;
    case kCooperativeVectorNV:
      iVar2 = (*this->_vptr_Type[0x3c])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_26,iVar2),seen_local,local_28);
      break;
    case kRayQueryKHR:
      iVar2 = (*this->_vptr_Type[0x3e])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_27,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_27,iVar2),seen_local,local_28);
      break;
    case kHitObjectNV:
      iVar2 = (*this->_vptr_Type[0x40])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_28,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_28,iVar2),seen_local,local_28);
      break;
    case kTensorLayoutNV:
      iVar2 = (*this->_vptr_Type[0x42])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_29,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_29,iVar2),seen_local,local_28);
      break;
    case kTensorViewNV:
      iVar2 = (*this->_vptr_Type[0x44])();
      seen_local = (SeenTypes *)
                   (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar2) + 0x228))
                             ((long *)CONCAT44(extraout_var_30,iVar2),seen_local,local_28);
      break;
    default:
      __assert_fail("false && \"Unhandled type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/types.cpp"
                    ,0xfc,
                    "size_t spvtools::opt::analysis::Type::ComputeHashValue(size_t, SeenTypes *) const"
                   );
    }
    utils::SmallVector<const_spvtools::opt::analysis::Type_*,_8UL>::pop_back(local_28);
    this_local = (Type *)seen_local;
  }
  else {
    this_local = (Type *)seen_local;
  }
  return (size_t)this_local;
}

Assistant:

size_t Type::ComputeHashValue(size_t hash, SeenTypes* seen) const {
  // Linear search through a dense, cache coherent vector is faster than O(log
  // n) search in a complex data structure (eg std::set) for the generally small
  // number of nodes.  It also skips the overhead of an new/delete per Type
  // (when inserting/removing from a set).
  if (std::find(seen->begin(), seen->end(), this) != seen->end()) {
    return hash;
  }

  seen->push_back(this);

  hash = hash_combine(hash, uint32_t(kind_));
  for (const auto& d : decorations_) {
    hash = hash_combine(hash, d);
  }

  switch (kind_) {
#define DeclareKindCase(type)                             \
  case k##type:                                           \
    hash = As##type()->ComputeExtraStateHash(hash, seen); \
    break
    DeclareKindCase(Void);
    DeclareKindCase(Bool);
    DeclareKindCase(Integer);
    DeclareKindCase(Float);
    DeclareKindCase(Vector);
    DeclareKindCase(Matrix);
    DeclareKindCase(Image);
    DeclareKindCase(Sampler);
    DeclareKindCase(SampledImage);
    DeclareKindCase(Array);
    DeclareKindCase(RuntimeArray);
    DeclareKindCase(NodePayloadArrayAMDX);
    DeclareKindCase(Struct);
    DeclareKindCase(Opaque);
    DeclareKindCase(Pointer);
    DeclareKindCase(Function);
    DeclareKindCase(Event);
    DeclareKindCase(DeviceEvent);
    DeclareKindCase(ReserveId);
    DeclareKindCase(Queue);
    DeclareKindCase(Pipe);
    DeclareKindCase(ForwardPointer);
    DeclareKindCase(PipeStorage);
    DeclareKindCase(NamedBarrier);
    DeclareKindCase(AccelerationStructureNV);
    DeclareKindCase(CooperativeMatrixNV);
    DeclareKindCase(CooperativeMatrixKHR);
    DeclareKindCase(CooperativeVectorNV);
    DeclareKindCase(RayQueryKHR);
    DeclareKindCase(HitObjectNV);
    DeclareKindCase(TensorLayoutNV);
    DeclareKindCase(TensorViewNV);
#undef DeclareKindCase
    default:
      assert(false && "Unhandled type");
      break;
  }

  seen->pop_back();
  return hash;
}